

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

int MAFSA_automaton_str_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  
  iVar2 = 0;
  sVar6 = 0;
  sVar7 = sVar6;
  if (sz_l != 0) {
    do {
      sVar7 = sVar6;
      if (l[sVar6] == delim) break;
      sVar6 = sVar6 + 1;
      sVar7 = sz_l;
    } while (sz_l != sVar6);
  }
  uVar3 = ((int)sz_l + ~(uint)sVar7) - 1;
  if (-1 < (int)uVar3) {
    iVar2 = 0;
    lVar4 = (ulong)uVar3 + 1;
    do {
      iVar2 = iVar2 * (uint)delim + (uint)l[lVar4 + sVar7];
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  *out = iVar2;
  return 0;
}

Assistant:

extern int MAFSA_automaton_str_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int(l + i + 1,
        sz_l - i - 1, delim, out);
}